

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPoints(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  string *psVar1;
  _Alloc_hider _Var2;
  PointSetNode *this_00;
  RTCGeometryType in_ECX;
  size_t siglen;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  uchar *extraout_RDX_03;
  undefined8 ctx;
  uchar *in_R8;
  size_t in_R9;
  ulong uVar3;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  __atomic_base<unsigned_long> local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  Vec3fx *local_90;
  _Base_ptr local_88;
  _Alloc_hider local_80;
  undefined8 *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  EVP_PKEY_CTX local_60 [16];
  undefined1 local_50 [32];
  
  local_78 = (undefined8 *)CONCAT44(in_register_00000014,type);
  psVar1 = (string *)*local_78;
  local_a8._M_i = (__int_type)&_Stack_98;
  local_50._16_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"material","");
  XML::child((XML *)&local_70,psVar1);
  loadMaterial((XMLLoader *)(local_50 + 0x18),xml);
  if ((EVP_PKEY_CTX *)local_70._M_allocated_capacity != (EVP_PKEY_CTX *)0x0) {
    (**(code **)(*(long *)local_70._M_allocated_capacity + 0x18))();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  this_00 = (PointSetNode *)operator_new(0xb0);
  local_50._8_8_ = local_50._24_8_;
  local_88 = (_Base_ptr)local_50._24_8_;
  local_80._M_p = (pointer)this_00;
  if ((_Base_ptr)local_50._24_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_50._24_8_ + 0x10))(local_50._24_8_);
  }
  siglen = 0;
  SceneGraph::PointSetNode::PointSetNode
            (this_00,in_ECX,(Ref<embree::SceneGraph::MaterialNode> *)(local_50 + 8),
             (BBox1f)0x3f80000000000000,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if ((_Base_ptr)local_50._8_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 0x18))();
  }
  psVar1 = (string *)*local_78;
  local_a8._M_i = (__int_type)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_positions","");
  XML::childOpt((XML *)&local_b0,psVar1);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  if (local_b0.ptr == (XML *)0x0) {
    psVar1 = (string *)*local_78;
    local_70._M_allocated_capacity = (size_type)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"positions","");
    XML::childOpt((XML *)local_50,psVar1);
    loadVec3ffArray((avector<Vec3ff> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_50);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&this_00->positions,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_a8);
    alignedFree(local_90);
    local_a0 = (element_type *)0x0;
    _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90 = (Vec3fx *)0x0;
    if ((XML *)local_50._0_8_ != (XML *)0x0) {
      (*((RefCount *)local_50._0_8_)->_vptr_RefCount[3])();
    }
    if ((EVP_PKEY_CTX *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    if (local_b0.ptr != (XML *)0x0) goto LAB_00186547;
  }
  else {
    if (((local_b0.ptr)->children).
        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        ((local_b0.ptr)->children).
        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        XML::child((XML *)&local_70,(size_t)local_b0.ptr);
        loadVec3ffArray((avector<Vec3ff> *)&local_a8,(XMLLoader *)xml,
                        (Ref<embree::XML> *)&local_70._M_allocated_capacity);
        std::
        vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    *)&this_00->positions,(avector<Vec3ff> *)&local_a8);
        alignedFree(local_90);
        local_a0 = (element_type *)0x0;
        _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_90 = (Vec3fx *)0x0;
        if ((EVP_PKEY_CTX *)local_70._M_allocated_capacity != (EVP_PKEY_CTX *)0x0) {
          (**(code **)(*(long *)local_70._M_allocated_capacity + 0x18))();
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)((local_b0.ptr)->children).
                                     super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((local_b0.ptr)->children).
                                     super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_00186547:
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])(local_b0.ptr);
  }
  psVar1 = (string *)*local_78;
  local_a8._M_i = (__int_type)&_Stack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_normals","");
  _Var2._M_p = local_80._M_p;
  XML::childOpt((XML *)&local_70,psVar1);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
    operator_delete((void *)local_a8._M_i);
  }
  if ((EVP_PKEY_CTX *)local_70._M_allocated_capacity == (EVP_PKEY_CTX *)0x0) {
    psVar1 = (string *)*local_78;
    local_a8._M_i = (__int_type)&_Stack_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normals","");
    XML::childOpt((XML *)&local_b0,psVar1);
    sig = extraout_RDX;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_i != &_Stack_98) {
      operator_delete((void *)local_a8._M_i);
      sig = extraout_RDX_00;
    }
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)(_Var2._M_p + 0x90),
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree(local_90);
      sig = extraout_RDX_01;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
        sig = extraout_RDX_02;
      }
    }
    ctx = local_70._M_allocated_capacity;
    if ((EVP_PKEY_CTX *)local_70._M_allocated_capacity == (EVP_PKEY_CTX *)0x0) goto LAB_001866f8;
  }
  else if (*(long *)(local_70._M_allocated_capacity + 0x88) !=
           *(long *)(local_70._M_allocated_capacity + 0x80)) {
    uVar3 = 0;
    do {
      XML::child((XML *)&local_b0,local_70._M_allocated_capacity);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)(_Var2._M_p + 0x90),(avector<Vec3fa> *)&local_a8);
      alignedFree(local_90);
      local_a0 = (element_type *)0x0;
      _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90 = (Vec3fx *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(*(long *)(local_70._M_allocated_capacity + 0x88) -
                             *(long *)(local_70._M_allocated_capacity + 0x80) >> 3));
  }
  ctx = local_70._M_allocated_capacity;
  (**(code **)(*(long *)local_70._M_allocated_capacity + 0x18))(local_70._M_allocated_capacity);
  sig = extraout_RDX_03;
LAB_001866f8:
  _Var2._M_p = local_80._M_p;
  SceneGraph::PointSetNode::verify
            ((PointSetNode *)local_80._M_p,(EVP_PKEY_CTX *)ctx,sig,siglen,in_R8,in_R9);
  (((FileName *)local_50._16_8_)->filename)._M_dataplus._M_p = _Var2._M_p;
  (**(code **)(*(long *)_Var2._M_p + 0x10))(_Var2._M_p);
  (**(code **)(*(long *)_Var2._M_p + 0x18))(_Var2._M_p);
  if (local_88 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_88 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_50._16_8_;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPoints(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }